

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall slang::ast::TypePrinter::append(TypePrinter *this,Type *type)

{
  char *begin;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  if ((this->options).addSingleQuotes == true) {
    ::fmt::v9::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"\'","");
  }
  if (((this->options).printAKA == true) && ((type->super_Symbol).kind == TypeAlias)) {
    begin = (type->super_Symbol).name._M_str;
    ::fmt::v9::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,begin,
               begin + (type->super_Symbol).name._M_len);
  }
  else {
    local_20._M_len = 0;
    local_20._M_str = "";
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
              (&type->super_Symbol,this,&local_20);
  }
  if ((this->options).addSingleQuotes == true) {
    ::fmt::v9::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"\'","");
  }
  if (((this->options).printAKA == true) && ((type->super_Symbol).kind == TypeAlias)) {
    printAKA(this,type);
  }
  return;
}

Assistant:

void TypePrinter::append(const Type& type) {
    if (options.addSingleQuotes)
        buffer->append("'");

    if (options.printAKA && type.kind == SymbolKind::TypeAlias)
        buffer->append(type.name);
    else
        type.visit(*this, ""sv);

    if (options.addSingleQuotes)
        buffer->append("'");

    if (options.printAKA && type.kind == SymbolKind::TypeAlias)
        printAKA(type);
}